

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_file.c
# Opt level: O0

int archive_read_open_FILE(archive *a,FILE *f)

{
  int iVar1;
  __syscall_slong_t *client_data;
  void *__ptr;
  void *b;
  size_t block_size;
  read_FILE_data *mine;
  stat st;
  FILE *f_local;
  archive *a_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)f;
  archive_clear_error(a);
  client_data = (__syscall_slong_t *)calloc(1,0x20);
  __ptr = malloc(0x20000);
  if ((client_data == (__syscall_slong_t *)0x0) || (__ptr == (void *)0x0)) {
    archive_set_error(a,0xc,"No memory");
    free(client_data);
    free(__ptr);
    a_local._4_4_ = -0x1e;
  }
  else {
    client_data[1] = 0x20000;
    client_data[2] = (__syscall_slong_t)__ptr;
    *client_data = st.__glibc_reserved[2];
    iVar1 = fileno((FILE *)*client_data);
    iVar1 = fstat(iVar1,(stat *)&mine);
    if ((iVar1 == 0) && (((uint)st.st_nlink & 0xf000) == 0x8000)) {
      archive_read_extract_set_skip_file(a,(la_int64_t)mine,st.st_dev);
      *(undefined1 *)(client_data + 3) = 1;
    }
    archive_read_set_read_callback(a,FILE_read);
    archive_read_set_skip_callback(a,FILE_skip);
    archive_read_set_seek_callback(a,FILE_seek);
    archive_read_set_close_callback(a,FILE_close);
    archive_read_set_callback_data(a,client_data);
    a_local._4_4_ = archive_read_open1(a);
  }
  return a_local._4_4_;
}

Assistant:

int
archive_read_open_FILE(struct archive *a, FILE *f)
{
	struct stat st;
	struct read_FILE_data *mine;
	size_t block_size = 128 * 1024;
	void *b;

	archive_clear_error(a);
	mine = calloc(1, sizeof(*mine));
	b = malloc(block_size);
	if (mine == NULL || b == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		free(mine);
		free(b);
		return (ARCHIVE_FATAL);
	}
	mine->block_size = block_size;
	mine->buffer = b;
	mine->f = f;
	/*
	 * If we can't fstat() the file, it may just be that it's not
	 * a file.  (On some platforms, FILE * objects can wrap I/O
	 * streams that don't support fileno()).  As a result, fileno()
	 * should be used cautiously.)
	 */
	if (fstat(fileno(mine->f), &st) == 0 && S_ISREG(st.st_mode)) {
		archive_read_extract_set_skip_file(a, st.st_dev, st.st_ino);
		/* Enable the seek optimization only for regular files. */
		mine->can_skip = 1;
	}

#if defined(__CYGWIN__) || defined(_WIN32)
	setmode(fileno(mine->f), O_BINARY);
#endif

	archive_read_set_read_callback(a, FILE_read);
	archive_read_set_skip_callback(a, FILE_skip);
	archive_read_set_seek_callback(a, FILE_seek);
	archive_read_set_close_callback(a, FILE_close);
	archive_read_set_callback_data(a, mine);
	return (archive_read_open1(a));
}